

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O2

char ** Corrade::Containers::
        arrayAppend<char_const*,Corrade::Containers::ArrayMallocAllocator<char_const*>>
                  (Array<const_char_*,_void_(*)(const_char_**,_unsigned_long)> *array,type *value)

{
  size_t sVar1;
  char **ppcVar2;
  ostream *output;
  Error local_40;
  
  ppcVar2 = array->_data;
  sVar1 = arrayCapacity<char_const*,Corrade::Containers::ArrayMallocAllocator<char_const*>>(array);
  if (sVar1 <= (ulong)((long)value - (long)ppcVar2 >> 3)) {
    ppcVar2 = Implementation::
              arrayGrowBy<char_const*,Corrade::Containers::ArrayMallocAllocator<char_const*>>
                        (array,1);
    *ppcVar2 = *value;
    return ppcVar2;
  }
  output = Utility::Error::defaultOutput();
  Utility::Error::Error(&local_40,output,(Flags)0x0);
  Utility::Debug::operator<<
            (&local_40.super_Debug,
             "Containers::arrayAppend(): use the list variant to append values from within the array itself"
            );
  Utility::Error::~Error(&local_40);
  abort();
}

Assistant:

inline T& arrayAppend(Array<T>& array, const typename std::common_type<T>::type& value) {
    CORRADE_DEBUG_ASSERT(std::size_t(&value - array.data()) >= arrayCapacity(array),
        "Containers::arrayAppend(): use the list variant to append values from within the array itself", *array.data());
    T* const it = Implementation::arrayGrowBy<T, Allocator>(array, 1);
    /* Can't use {}, see the GCC 4.8-specific overload for details */
    #if defined(CORRADE_TARGET_GCC) && !defined(CORRADE_TARGET_CLANG) &&  __GNUC__ < 5
    Implementation::construct(*it, value);
    #else
    new(it) T{value};
    #endif
    return *it;
}